

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Root root,char *vendor,char *application)

{
  undefined1 *puVar1;
  Node *pNVar2;
  char *pcVar3;
  RootNode *this_00;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  pNVar2 = (Node *)operator_new(0x48);
  pcVar3 = strdup(".");
  pNVar2->path_ = pcVar3;
  pNVar2->child_ = (Node *)0x0;
  pNVar2->next_ = (Node *)0x0;
  (pNVar2->field_2).parent_ = (Node *)0x0;
  pNVar2->index_ = (Node **)0x0;
  pNVar2->nIndex_ = 0;
  pNVar2->NIndex_ = 0;
  pNVar2->entry_ = (Entry *)0x0;
  pNVar2->nEntry_ = 0;
  pNVar2->NEntry_ = 0;
  pNVar2->field_0x30 = 0;
  this->node = pNVar2;
  this_00 = (RootNode *)operator_new(0x20);
  RootNode::RootNode(this_00,this,root,vendor,application);
  this->rootNode = this_00;
  pNVar2 = this->node;
  (pNVar2->field_2).root_ = this_00;
  puVar1 = &pNVar2->field_0x30;
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Root root, const char *vendor, const char *application ) {
  node = new Node( "." );
  rootNode = new RootNode( this, root, vendor, application );
  node->setRoot(rootNode);
}